

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_cont_mgau.c
# Opt level: O3

int32 approx_cont_mgau_frame_eval
                (mdef_t *mdef,subvq_t *svq,gs_t *gs,mgau_model_t *g,fast_gmm_t *fastgmm,ascr_t *a,
                float32 *feat,int32 frame,int32 *cache_ci_senscr,ptmr_t *tm_ovrhd,logmath_t *logmath
                )

{
  float fVar1;
  uint8 uVar2;
  int32 svq_beam;
  int iVar3;
  int32 *piVar4;
  s3senid_t *psVar5;
  int32 *senscr;
  uint8 *puVar6;
  uint8 *puVar7;
  int *__base;
  downsampling_t *pdVar8;
  gau_select_t *pgVar9;
  int32 best_cid;
  int32 iVar10;
  int iVar11;
  gmm_select_t *pgVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  size_t __nmemb;
  int iVar17;
  long lVar18;
  bool bVar19;
  int local_a4;
  uint local_90;
  int local_8c;
  int32 single_el_list [2];
  
  single_el_list[0] = -1;
  single_el_list[1] = -1;
  svq_beam = fastgmm->gaus->subvqbeam;
  piVar4 = fastgmm->gmms->ci_occu;
  psVar5 = mdef->cd2cisen;
  senscr = a->senscr;
  puVar6 = a->sen_active;
  puVar7 = a->rec_sen_active;
  ptmr_start(tm_ovrhd);
  if (gs == (gs_t *)0x0) {
    best_cid = -1;
  }
  else {
    best_cid = gc_compute_closest_cw(gs,feat);
  }
  if (svq != (subvq_t *)0x0) {
    subvq_gautbl_eval_logs3(svq,feat,logmath);
  }
  pgVar12 = fastgmm->gmms;
  iVar14 = mdef->n_ci_sen;
  if (pgVar12->max_cd < mdef->n_sen - iVar14) {
    ci = cache_ci_senscr;
    __base = pgVar12->idx;
    if (0 < g->n_mgau) {
      lVar16 = 0;
      do {
        iVar10 = mdef_is_cisenone(mdef,(s3senid_t)lVar16);
        if (iVar10 == 0) {
          if ((puVar6 == (uint8 *)0x0) || (puVar6[lVar16] != '\0')) {
            piVar4[psVar5[lVar16]] = piVar4[psVar5[lVar16]] + 1;
          }
        }
        else {
          piVar4[lVar16] = 0;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < g->n_mgau);
      iVar14 = mdef->n_ci_sen;
    }
    if (iVar14 < 1) {
      __nmemb = (size_t)iVar14;
    }
    else {
      lVar16 = 0;
      do {
        __base[lVar16] = (int)lVar16;
        lVar16 = lVar16 + 1;
        __nmemb = (size_t)mdef->n_ci_sen;
      } while (lVar16 < (long)__nmemb);
    }
    qsort(__base,__nmemb,4,intcmp);
    iVar14 = cache_ci_senscr[*__base];
    pgVar12 = fastgmm->gmms;
    iVar10 = pgVar12->ci_pbeam;
    pgVar12->dyn_ci_pbeam = iVar10;
    if (0 < (long)mdef->n_ci_sen) {
      lVar16 = 0;
      iVar17 = 0;
      do {
        if (cache_ci_senscr[__base[lVar16]] <= iVar10 + iVar14) break;
        iVar17 = iVar17 + piVar4[__base[lVar16]];
        if (pgVar12->max_cd < iVar17) {
          iVar10 = cache_ci_senscr[__base[lVar16]] - iVar14;
          pgVar12->dyn_ci_pbeam = iVar10;
          break;
        }
        lVar16 = lVar16 + 1;
      } while (mdef->n_ci_sen != lVar16);
    }
  }
  else {
    iVar10 = pgVar12->ci_pbeam;
  }
  fVar1 = (float)pgVar12->tighten_factor;
  ptmr_stop(tm_ovrhd);
  pdVar8 = fastgmm->downs;
  iVar14 = pdVar8->ds_ratio;
  if (iVar14 == 0) {
    __assert_fail("fg->downs->ds_ratio != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/approx_cont_mgau.c"
                  ,0x73,"int32 approx_isskip(int32, fast_gmm_t *, int32)");
  }
  pgVar9 = fastgmm->gaus;
  if ((0 < pdVar8->cond_ds) && (0 < pdVar8->dist_ds)) {
    __assert_fail("!(cond_ds > 0 && dist_ds > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/approx_cont_mgau.c"
                  ,0x74,"int32 approx_isskip(int32, fast_gmm_t *, int32)");
  }
  if (pdVar8->cond_ds < 1) {
    bVar19 = frame % iVar14 != 0;
    local_90 = (uint)bVar19;
    pgVar9->rec_bstcid = best_cid;
    iVar14 = (int)(fVar1 * (float)iVar10);
    if (!bVar19) {
      iVar14 = iVar10;
    }
  }
  else {
    if (pgVar9->rec_bstcid == best_cid) {
      if (pdVar8->skip_count < iVar14 + -1) {
        pdVar8->skip_count = pdVar8->skip_count + 1;
        pgVar9->rec_bstcid = best_cid;
        local_90 = 1;
        iVar14 = (int)(fVar1 * (float)iVar10);
        goto LAB_00105ec7;
      }
      pdVar8->skip_count = 0;
    }
    pgVar9->rec_bstcid = best_cid;
    local_90 = 0;
    iVar14 = iVar10;
  }
LAB_00105ec7:
  if (g->n_mgau < 1) {
    local_8c = 0;
    iVar17 = -0x80000000;
    local_a4 = 0;
  }
  else {
    lVar16 = 0;
    iVar17 = -0x80000000;
    lVar18 = 6;
    local_8c = 0;
    local_a4 = 0;
    iVar15 = -0x80000000;
    do {
      if (puVar6 == (uint8 *)0x0) {
        iVar10 = mdef_is_cisenone(mdef,(s3senid_t)lVar16);
        if (iVar10 != 0) goto LAB_00105f3a;
LAB_00105f6b:
        iVar11 = senscr[psVar5[lVar16]];
        if (iVar11 < iVar14 + iVar15) {
          iVar3 = *(int *)((long)g->mgau + lVar18 * 2 + -8);
          if ((iVar3 == -1) || (*(int *)((long)&g->mgau->n_comp + lVar18 * 2) != frame + -1)) {
            senscr[lVar16] = iVar11;
          }
          else {
            single_el_list[0] = iVar3;
            iVar11 = mgau_eval(g,(int32)lVar16,single_el_list,feat,frame,local_90);
            senscr[lVar16] = iVar11;
            local_a4 = local_a4 + 1;
          }
        }
        else {
          iVar10 = approx_mgau_eval(gs,svq,g,fastgmm,(int32)lVar16,senscr,feat,best_cid,svq_beam,
                                    frame);
          local_a4 = local_a4 + iVar10;
          local_8c = local_8c + 1;
          iVar11 = senscr[lVar16];
        }
        if (iVar17 <= iVar11) {
          iVar17 = iVar11;
        }
      }
      else {
        uVar2 = puVar6[lVar16];
        iVar10 = mdef_is_cisenone(mdef,(s3senid_t)lVar16);
        if (iVar10 == 0) {
          if (uVar2 != '\0') goto LAB_00105f6b;
        }
        else {
LAB_00105f3a:
          iVar11 = cache_ci_senscr[lVar16];
          senscr[lVar16] = iVar11;
          if (iVar15 <= iVar11) {
            iVar15 = iVar11;
          }
          if (iVar17 <= iVar11) {
            iVar17 = iVar11;
          }
          puVar6[lVar16] = '\x01';
        }
      }
      puVar7[lVar16] = puVar6[lVar16];
      lVar16 = lVar16 + 1;
      uVar13 = (ulong)g->n_mgau;
      lVar18 = lVar18 + 0x20;
    } while (lVar16 < (long)uVar13);
    if (0 < g->n_mgau) {
      lVar16 = 0;
      do {
        if (puVar6[lVar16] != '\0') {
          senscr[lVar16] = senscr[lVar16] - iVar17;
          uVar13 = (ulong)(uint)g->n_mgau;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < (int)uVar13);
    }
  }
  g->frm_sen_eval = local_8c;
  g->frm_gau_eval = local_a4;
  return iVar17;
}

Assistant:

int32
approx_cont_mgau_frame_eval(mdef_t * mdef,
                            subvq_t * svq,
                            gs_t * gs,
                            mgau_model_t * g,
                            fast_gmm_t * fastgmm,
                            ascr_t * a,
                            float32 * feat,
                            int32 frame,
                            int32 * cache_ci_senscr,
                            ptmr_t * tm_ovrhd,
                            logmath_t * logmath)
{
    int32 s;
    int32 best, ns, ng, n_cis, n_cig;
    int32 best_cid;
    int32 is_skip;
    int32 is_compute;
    int32 pbest;
    int32 is_ciphone;
    int32 svq_beam;
    int32 *ci_occ;
    s3senid_t *cd2cisen;

    int32 total;
    int32 dyn_ci_pbeam;
    float32 tighten_factor;

    int32 single_el_list[2];
    uint8 *sen_active;
    uint8 *rec_sen_active;
    int32 *senscr;

    best = MAX_NEG_INT32;
    pbest = MAX_NEG_INT32;
    ns = 0;
    n_cis = 0;
    n_cig = 0;
    ng = 0;
    total = 0;
    best_cid = -1;


    single_el_list[0] = -1;
    single_el_list[1] = -1;
    svq_beam = fastgmm->gaus->subvqbeam;

    ci_occ = fastgmm->gmms->ci_occu;
    cd2cisen = mdef_cd2cisen(mdef);

    sen_active = a->sen_active;
    rec_sen_active = a->rec_sen_active;
    senscr = a->senscr;

    ptmr_start(tm_ovrhd);
    if (gs)
        best_cid = gc_compute_closest_cw(gs, feat);
    if (svq)
        subvq_gautbl_eval_logs3(svq, feat, logmath);

    if (fastgmm->gmms->max_cd < mdef->n_sen - mdef->n_ci_sen)
        dyn_ci_pbeam = approx_compute_dyn_ci_pbeam(mdef, fastgmm, g,
                                                   ci_occ, sen_active,
                                                   cache_ci_senscr,
                                                   cd2cisen);
    else
        dyn_ci_pbeam = fastgmm->gmms->ci_pbeam;

    tighten_factor = fastgmm->gmms->tighten_factor;

    ptmr_stop(tm_ovrhd);

    is_skip = approx_isskip(frame, fastgmm, best_cid);
    fastgmm->gaus->rec_bstcid = best_cid;

    /* Use the original */

    /* If the frame is "skipped", tighten the beam. */
    if (is_skip) {
        dyn_ci_pbeam = (int32) ((float32) dyn_ci_pbeam * tighten_factor);
    }

    for (s = 0; s < g->n_mgau; s++) {
        is_compute = !sen_active || sen_active[s];
        is_ciphone = mdef_is_cisenone(mdef, s);

#if 0
        if (sen_active[s])
            E_INFO
                ("Sen active %d, rec_sen_active %d, sen id %d cisen id %d, best index %d, update time %d\n",
                 sen_active[s], rec_sen_active[s], s, cd2cisen[s],
                 g->mgau[s].bstidx, g->mgau[s].updatetime);
#endif

        /* Compute the score of the CI phone even if it is not active. */
        if (is_ciphone) {
            /*Just copied from the cache, we just do accouting here */
            /*E_INFO("At senone %d, CI phoneme score %d \n",s,cache_ci_senscr[s]); */
            senscr[s] = cache_ci_senscr[s];
            if (pbest < senscr[s])
                pbest = senscr[s];
            if (best < senscr[s])
                best = senscr[s];
            sen_active[s] = 1;
        }
        else {
            if (is_compute) {
                if ((senscr[cd2cisen[s]] >= pbest + dyn_ci_pbeam)) {
                    ng +=
                        approx_mgau_eval(gs, svq, g, fastgmm, s, senscr,
                                         feat, best_cid, svq_beam, frame);
                    ns++;
                }
                else {

                    /* 3.6 logic: 
                       Whenever it is possible, CD senone score is backed off to the
                       score computed by the best matching index. Otherwise, CI
                       scores will be used.
                     */
                    if (g->mgau[s].bstidx == NO_BSTIDX ||       /* If the gaussian was not computed before. or */
                        g->mgau[s].updatetime != frame - 1      /* It the gaussian was not updated in last frame */
                        ) {
                        /*Previous frames, senone s is not computed. 
                           or the best index is not trusted. 
                           Use CI score in these cases. */
#ifdef GAUDEBUG
                        E_INFO
                            ("USE CI SENONE SCORE at senone %d time %d\n",
                             s, frame);
#endif

                        senscr[s] = senscr[cd2cisen[s]];

                    }
                    else {
                        /*Don't change the bstidx and updatetime */
                        single_el_list[0] = g->mgau[s].bstidx;

                        /*ARCHAN: Please don't rewrite this two lines. I want to make a contrast between the two situations. */
                        if (is_skip)
                            senscr[s] = mgau_eval(g, s, single_el_list, feat, frame, 1);        /*Update the best idx, such that next frames can use it */
                        else
                            senscr[s] = mgau_eval(g, s, single_el_list, feat, frame, 0);        /*Not update the best index in a Gaussian */

                        ng++;   /* But don't increase the number of senone compute. It doesn't count. */

#ifdef GAUDEBUG
                        E_INFO
                            ("RECOMPUTE for senone %d USING BEST INDEX %d time %d, single Gauss score %d, ci score %d, last ci score %d. \n",
                             s, g->mgau[s].bstidx, frame, senscr[s],
                             senscr[cd2cisen[s]], g->mgau[s].bstscr);
#endif

                    }
                }
                if (best < senscr[s])
                    best = senscr[s];
            }
        }
        /*Make a copy to the most recent active list */
        rec_sen_active[s] = sen_active[s];
    }

    for (s = 0; s < g->n_mgau; s++) {
        if (sen_active[s])
            senscr[s] -= best;
    }


    /*Don't delete this line, it is very useful in analysing the performance */

#if APPROX_ANALYSE
    E_INFO("time: %d , cisen %d, sen: %d, gau: %d\n", frame, n_cis, ns,
           ng);
#endif

    g->frm_sen_eval = ns;
    g->frm_gau_eval = ng;
    ci_occ = NULL;
    return best;


}